

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_group
          (string *__return_storage_ptr__,Formatter *this,string *group,bool is_positional,
          vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *opts)

{
  pointer ppOVar1;
  ostream *poVar2;
  pointer ppOVar3;
  stringstream out;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = ::std::operator<<(local_1a8,"\n");
  poVar2 = ::std::operator<<(poVar2,(string *)group);
  ::std::operator<<(poVar2,":\n");
  ppOVar1 = (opts->super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppOVar3 = (opts->
                 super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppOVar3 != ppOVar1; ppOVar3 = ppOVar3 + 1
      ) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xb])
              (local_1d8,this,*ppOVar3,(ulong)is_positional);
    ::std::operator<<(local_1a8,local_1d8);
    ::std::__cxx11::string::~string(local_1d8);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
Formatter::make_group(std::string group, bool is_positional, std::vector<const Option *> opts) const {
    std::stringstream out;

    out << "\n" << group << ":\n";
    for(const Option *opt : opts) {
        out << make_option(opt, is_positional);
    }

    return out.str();
}